

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Function * __thiscall wasm::Module::getFunction(Module *this,Name name)

{
  mapped_type pFVar1;
  mapped_type *ppFVar2;
  string *in_R8;
  Name name_00;
  string local_50 [39];
  allocator<char> local_29;
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getFunction",&local_29);
  name_00.super_IString.str._M_str = (char *)local_50;
  ppFVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Function*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Function*>>>>
                      ((wasm *)&this->functionsMap,name.super_IString.str._M_len,name_00,in_R8);
  pFVar1 = *ppFVar2;
  std::__cxx11::string::~string(local_50);
  return pFVar1;
}

Assistant:

Function* Module::getFunction(Name name) {
  return getModuleElement(functionsMap, name, "getFunction");
}